

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void ot::commissioner::utils::Encode<unsigned_short>(ByteArray *aBuf,unsigned_short aInteger)

{
  size_type sVar1;
  reference pvVar2;
  undefined8 local_28;
  size_t i;
  size_type length;
  unsigned_short aInteger_local;
  ByteArray *aBuf_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aBuf,sVar1 + 2);
  local_28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  length._6_2_ = aInteger;
  for (; sVar1 < local_28; local_28 = local_28 - 1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (aBuf,local_28 - 1);
    *pvVar2 = (value_type)length._6_2_;
    length._6_2_ = length._6_2_ >> 8;
  }
  return;
}

Assistant:

void Encode(ByteArray &aBuf, T aInteger)
{
    auto length = aBuf.size();
    aBuf.resize(length + sizeof(T));
    for (size_t i = aBuf.size(); i > length; --i)
    {
        aBuf[i - 1] = aInteger & 0xFF;
        aInteger >>= 8;
    }
}